

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O3

void __thiscall license::test::env_var_not_defined::test_method(env_var_not_defined *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  undefined1 local_1d8 [24];
  char *local_1c0;
  undefined **local_1b8;
  ulong local_1b0;
  shared_count sStack_1a8;
  long **local_1a0;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  LicenseReader licenseReader;
  undefined4 local_164;
  long local_160;
  long *local_158;
  undefined4 *local_150;
  undefined1 local_148;
  undefined8 local_140;
  shared_count sStack_138;
  EventRegistry registry;
  char *local_c0;
  char *local_b8;
  undefined **local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  unsetenv("LICENSE_LOCATION");
  locate::LocatorFactory::find_license_near_moduleb = 0;
  locate::LocatorFactory::find_license_with_env_varb = 1;
  LicenseReader::LicenseReader(&licenseReader,(LicenseLocation *)0x0);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._0_8_ = local_1d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"PRODUCT","");
  LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_1d8,&licenseInfos);
  if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
    operator_delete((void *)local_1d8._0_8_);
  }
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x54);
  bVar1 = EventRegistry::isGood(&registry);
  local_1b8 = (undefined **)CONCAT71(local_1b8._1_7_,!bVar1);
  local_1b0 = 0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = (char *)&local_b0;
  local_b0 = (undefined **)0x1a2163;
  local_a8 = "";
  local_1d8[8] = 0;
  local_1d8._0_8_ = &PTR__lazy_ostream_001cf218;
  local_1d8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion(&local_1b8,local_1d8,&local_70,0x54,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x55);
  local_160 = ((long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
  local_148 = licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (char *)((ulong)local_a8 & 0xffffffffffffff00);
  local_b0 = &PTR__lazy_ostream_001cf268;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_150 = &local_164;
  local_164 = 0;
  local_158 = &local_160;
  local_140 = 0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
  ;
  local_38 = "";
  local_1c0 = (char *)&local_150;
  local_1d8[8] = 0;
  local_1d8._0_8_ = &PTR__lazy_ostream_001cf2a8;
  local_1d8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_158;
  local_1b0 = local_1b0 & 0xffffffffffffff00;
  local_1b8 = &PTR__lazy_ostream_001cf2e8;
  sStack_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_138);
  pAVar2 = EventRegistry::getLastFailure(&registry);
  if (pAVar2 != (AuditEvent *)0x0) {
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
    ;
    local_b8 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x58);
    pAVar2 = EventRegistry::getLastFailure(&registry);
    local_1b8 = (undefined **)
                CONCAT71(local_1b8._1_7_,pAVar2->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED);
    local_1b0 = 0;
    sStack_1a8.pi_ = (sp_counted_base *)0x0;
    local_1d8[8] = 0;
    local_1d8._0_8_ = &PTR__lazy_ostream_001cf368;
    local_1d8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1c0 = "error as expected";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_1a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree(&registry.mostAdvancedLogIdx_by_LicenseId._M_t);
    if (registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer_conflict)0x0) {
      operator_delete(registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenseInfos);
    LicenseReader::~LicenseReader(&licenseReader);
    return;
  }
  __assert_fail("registry.getLastFailure() != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseReader_test.cpp"
                ,0x56,"void license::test::env_var_not_defined::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(env_var_not_defined) {
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
	locate::LocatorFactory::find_license_near_module(false);
	locate::LocatorFactory::find_license_with_env_var(true);
	LicenseReader licenseReader(nullptr);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT", licenseInfos);
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_MESSAGE((ENVIRONMENT_VARIABLE_NOT_DEFINED == registry.getLastFailure()->event_type),
						"error as expected");
}